

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_get_declared_struct_size(spvc_compiler compiler,spvc_type struct_type,size_t *size)

{
  pointer this;
  size_t sVar1;
  exception *e;
  size_t *size_local;
  spvc_type struct_type_local;
  spvc_compiler compiler_local;
  
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  sVar1 = spirv_cross::Compiler::get_declared_struct_size(this,(SPIRType *)struct_type);
  *size = sVar1;
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_declared_struct_size(spvc_compiler compiler, spvc_type struct_type, size_t *size)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		*size = compiler->compiler->get_declared_struct_size(*static_cast<const SPIRType *>(struct_type));
	}